

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringify-walker-impl.h
# Opt level: O0

void __thiscall
wasm::StringifyWalker<TestStringifyWalker>::addUniqueSymbol
          (StringifyWalker<TestStringifyWalker> *this,SeparatorReason reason)

{
  SeparatorReason reason_00;
  undefined1 in_DL;
  _Variadic_union<wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::End>
  in_RSI;
  TestStringifyWalker *self;
  StringifyWalker<TestStringifyWalker> *this_local;
  SeparatorReason reason_local;
  
  reason_00.reason.
  super__Variant_base<wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::End>
  .
  super__Move_assign_alias<wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::End>
  .
  super__Copy_assign_alias<wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::End>
  .
  super__Move_ctor_alias<wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::End>
  .
  super__Copy_ctor_alias<wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::End>
  .
  super__Variant_storage_alias<wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::End>
  ._9_7_ = reason_local.reason.
           super__Variant_base<wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::End>
           .
           super__Move_assign_alias<wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::End>
           .
           super__Copy_assign_alias<wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::End>
           .
           super__Move_ctor_alias<wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::End>
           .
           super__Copy_ctor_alias<wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::End>
           .
           super__Variant_storage_alias<wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::End>
           ._M_u._1_7_;
  reason_00.reason.
  super__Variant_base<wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::End>
  .
  super__Move_assign_alias<wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::End>
  .
  super__Copy_assign_alias<wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::End>
  .
  super__Move_ctor_alias<wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::End>
  .
  super__Copy_ctor_alias<wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::End>
  .
  super__Variant_storage_alias<wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::End>
  ._M_index = in_DL;
  reason_00.reason.
  super__Variant_base<wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::End>
  .
  super__Move_assign_alias<wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::End>
  .
  super__Copy_assign_alias<wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::End>
  .
  super__Move_ctor_alias<wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::End>
  .
  super__Copy_ctor_alias<wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::End>
  .
  super__Variant_storage_alias<wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<TestStringifyWalker>::SeparatorReason::End>
  ._M_u = in_RSI;
  StringifyTest_Print_Test::TestBody()::TestStringifyWalker::addUniqueSymbol(wasm::
  StringifyWalker<TestStringifyWalker>::SeparatorReason_(this,reason_00);
  return;
}

Assistant:

inline void StringifyWalker<SubType>::addUniqueSymbol(SeparatorReason reason) {
  // TODO: Add the following static_assert when the compilers running our GitHub
  // actions are updated enough to know that this is a constant condition:
  // static_assert(&StringifyWalker<SubType>::addUniqueSymbol !=
  // &SubType::addUniqueSymbol);
  auto self = static_cast<SubType*>(this);
  self->addUniqueSymbol(reason);
}